

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O0

void ABC_Network_Finalize(ABC_Manager mng)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  ABC_Manager mng_local;
  
  pNtk_00 = mng->pNtk;
  for (local_24 = 0; iVar1 = Abc_NtkPiNum(pNtk_00), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPi(pNtk_00,local_24);
    pcVar3 = ABC_GetNodeName(mng,pAVar2);
    Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
  }
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(pNtk_00), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPo(pNtk_00,local_24);
    pcVar3 = ABC_GetNodeName(mng,pAVar2);
    Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
  }
  iVar1 = Abc_NtkLatchNum(pNtk_00);
  if (iVar1 != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                  ,0x13d,"void ABC_Network_Finalize(ABC_Manager)");
  }
  return;
}

Assistant:

void ABC_Network_Finalize( ABC_Manager mng )
{
    Abc_Ntk_t * pNtk = mng->pNtk;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, ABC_GetNodeName(mng, pObj), NULL );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_ObjAssignName( pObj, ABC_GetNodeName(mng, pObj), NULL );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
}